

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl.c
# Opt level: O1

QDLDL_int QDLDL_factor(QDLDL_int n,QDLDL_int *Ap,QDLDL_int *Ai,QDLDL_float *Ax,QDLDL_int *Lp,
                      QDLDL_int *Li,QDLDL_float *Lx,QDLDL_float *D,QDLDL_float *Dinv,QDLDL_int *Lnz,
                      QDLDL_int *etree,QDLDL_bool *bwork,QDLDL_int *iwork,QDLDL_float *fwork)

{
  double dVar1;
  double dVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  long *plVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  *Lp = 0;
  if (0 < n) {
    lVar9 = 0;
    do {
      Lp[lVar9 + 1] = Lnz[lVar9] + Lp[lVar9];
      bwork[lVar9] = '\0';
      fwork[lVar9] = 0.0;
      D[lVar9] = 0.0;
      iwork[n * 2 + lVar9] = Lp[lVar9];
      lVar9 = lVar9 + 1;
    } while (n != lVar9);
  }
  dVar1 = *Ax;
  *D = dVar1;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    uVar5 = (ulong)(0.0 < dVar1);
    *Dinv = 1.0 / dVar1;
    if (1 < n) {
      plVar8 = iwork + n;
      lVar9 = 1;
      do {
        lVar10 = Ap[lVar9];
        lVar3 = Ap[lVar9 + 1];
        if (lVar10 < lVar3) {
          lVar6 = 0;
          do {
            lVar11 = Ai[lVar10];
            if (lVar11 == lVar9) {
              D[lVar9] = Ax[lVar10];
            }
            else {
              fwork[lVar11] = Ax[lVar10];
              if (bwork[lVar11] == '\0') {
                bwork[lVar11] = '\x01';
                *plVar8 = lVar11;
                lVar11 = etree[lVar11];
                lVar12 = 1;
                if (lVar11 < lVar9 && lVar11 != -1) {
                  while (bwork[lVar11] != '\x01') {
                    bwork[lVar11] = '\x01';
                    plVar8[lVar12] = lVar11;
                    lVar12 = lVar12 + 1;
                    lVar11 = etree[lVar11];
                    if ((lVar11 == -1) || (lVar9 <= lVar11)) break;
                  }
                }
                plVar7 = iwork + lVar6;
                lVar11 = 0;
                do {
                  *plVar7 = plVar8[lVar12 + lVar11 + -1];
                  lVar11 = lVar11 + -1;
                  plVar7 = plVar7 + 1;
                } while (-lVar11 != lVar12);
                lVar6 = lVar6 - lVar11;
              }
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != lVar3);
        }
        else {
          lVar6 = 0;
        }
        if (0 < lVar6) {
          do {
            lVar10 = iwork[lVar6 + -1];
            lVar3 = iwork[n * 2 + lVar10];
            dVar1 = fwork[lVar10];
            lVar11 = Lp[lVar10];
            if (lVar11 < lVar3) {
              do {
                fwork[Li[lVar11]] = fwork[Li[lVar11]] - Lx[lVar11] * dVar1;
                lVar11 = lVar11 + 1;
              } while (lVar3 != lVar11);
            }
            Li[lVar3] = lVar9;
            dVar2 = Dinv[lVar10];
            Lx[lVar3] = dVar2 * dVar1;
            D[lVar9] = D[lVar9] - dVar2 * dVar1 * dVar1;
            iwork[n * 2 + lVar10] = iwork[n * 2 + lVar10] + 1;
            fwork[lVar10] = 0.0;
            bwork[lVar10] = '\0';
            bVar4 = 1 < lVar6;
            lVar6 = lVar6 + -1;
          } while (bVar4);
        }
        lVar10 = lVar9 + 1;
        dVar1 = D[lVar9];
        if ((dVar1 == 0.0) && (!NAN(dVar1))) goto LAB_00101714;
        uVar5 = uVar5 + (0.0 < dVar1);
        Dinv[lVar9] = 1.0 / dVar1;
        lVar9 = lVar10;
      } while (lVar10 != n);
    }
  }
  else {
LAB_00101714:
    uVar5 = 0xffffffffffffffff;
  }
  return uVar5;
}

Assistant:

QDLDL_int QDLDL_factor(const QDLDL_int    n,
                  const QDLDL_int*   Ap,
                  const QDLDL_int*   Ai,
                  const QDLDL_float* Ax,
                  QDLDL_int*   Lp,
                  QDLDL_int*   Li,
                  QDLDL_float* Lx,
                  QDLDL_float* D,
                  QDLDL_float* Dinv,
                  const QDLDL_int* Lnz,
                  const QDLDL_int* etree,
                  QDLDL_bool*  bwork,
                  QDLDL_int*   iwork,
                  QDLDL_float* fwork){

  QDLDL_int i,j,k,nnzY, bidx, cidx, nextIdx, nnzE, tmpIdx;
  QDLDL_int *yIdx, *elimBuffer, *LNextSpaceInCol;
  QDLDL_float *yVals;
  QDLDL_float yVals_cidx;
  QDLDL_bool  *yMarkers;
  QDLDL_int   positiveValuesInD = 0;

  //partition working memory into pieces
  yMarkers        = bwork;
  yIdx            = iwork;
  elimBuffer      = iwork + n;
  LNextSpaceInCol = iwork + n*2;
  yVals           = fwork;


  Lp[0] = 0; //first column starts at index zero

  for(i = 0; i < n; i++){

    //compute L column indices
    Lp[i+1] = Lp[i] + Lnz[i];   //cumsum, total at the end

    // set all Yidx to be 'unused' initially
    //in each column of L, the next available space
    //to start is just the first space in the column
    yMarkers[i]  = QDLDL_UNUSED;
    yVals[i]     = 0.0;
    D[i]         = 0.0;
    LNextSpaceInCol[i] = Lp[i];
  }

  // First element of the diagonal D.
  D[0]     = Ax[0];
  if(D[0] == 0.0){return -1;}
  if(D[0]  > 0.0){positiveValuesInD++;}
  Dinv[0] = 1/D[0];

  //Start from 1 here. The upper LH corner is trivially 0
  //in L b/c we are only computing the subdiagonal elements
  for(k = 1; k < n; k++){

    //NB : For each k, we compute a solution to
    //y = L(0:(k-1),0:k-1))\b, where b is the kth
    //column of A that sits above the diagonal.
    //The solution y is then the kth row of L,
    //with an implied '1' at the diagonal entry.

    //number of nonzeros in this row of L
    nnzY = 0;  //number of elements in this row

    //This loop determines where nonzeros
    //will go in the kth row of L, but doesn't
    //compute the actual values
    tmpIdx = Ap[k+1];

    for(i = Ap[k]; i < tmpIdx; i++){

      bidx = Ai[i];   // we are working on this element of b

      //Initialize D[k] as the element of this column
      //corresponding to the diagonal place.  Don't use
      //this element as part of the elimination step
      //that computes the k^th row of L
      if(bidx == k){
        D[k] = Ax[i];
        continue;
      }

      yVals[bidx] = Ax[i];   // initialise y(bidx) = b(bidx)

      // use the forward elimination tree to figure
      // out which elements must be eliminated after
      // this element of b
      nextIdx = bidx;

      if(yMarkers[nextIdx] == QDLDL_UNUSED){   //this y term not already visited

        yMarkers[nextIdx] = QDLDL_USED;     //I touched this one
        elimBuffer[0]     = nextIdx;  // It goes at the start of the current list
        nnzE              = 1;         //length of unvisited elimination path from here

        nextIdx = etree[bidx];

        while(nextIdx != QDLDL_UNKNOWN && nextIdx < k){
          if(yMarkers[nextIdx] == QDLDL_USED) break;

          yMarkers[nextIdx] = QDLDL_USED;   //I touched this one
          elimBuffer[nnzE] = nextIdx; //It goes in the current list
          nnzE++;                     //the list is one longer than before
          nextIdx = etree[nextIdx];   //one step further along tree

        } //end while

        // now I put the buffered elimination list into
        // my current ordering in reverse order
        while(nnzE){
          yIdx[nnzY++] = elimBuffer[--nnzE];
        } //end while
      } //end if

    } //end for i

    //This for loop places nonzeros values in the k^th row
    for(i = (nnzY-1); i >=0; i--){

      //which column are we working on?
      cidx = yIdx[i];

      // loop along the elements in this
      // column of L and subtract to solve to y
      tmpIdx = LNextSpaceInCol[cidx];
      yVals_cidx = yVals[cidx];
      for(j = Lp[cidx]; j < tmpIdx; j++){
        yVals[Li[j]] -= Lx[j]*yVals_cidx;
      }

      //Now I have the cidx^th element of y = L\b.
      //so compute the corresponding element of
      //this row of L and put it into the right place
      Li[tmpIdx] = k;
      Lx[tmpIdx] = yVals_cidx *Dinv[cidx];

      //D[k] -= yVals[cidx]*yVals[cidx]*Dinv[cidx];
      D[k] -= yVals_cidx*Lx[tmpIdx];
      LNextSpaceInCol[cidx]++;

      //reset the yvalues and indices back to zero and QDLDL_UNUSED
      //once I'm done with them
      yVals[cidx]     = 0.0;
      yMarkers[cidx]  = QDLDL_UNUSED;

    } //end for i

    //Maintain a count of the positive entries
    //in D.  If we hit a zero, we can't factor
    //this matrix, so abort
    if(D[k] == 0.0){return -1;}
    if(D[k]  > 0.0){positiveValuesInD++;}

    //compute the inverse of the diagonal
    Dinv[k]= 1/D[k];

  } //end for k

  return positiveValuesInD;

}